

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

void ZSTD_ldm_adjustParameters(ldmParams_t *params,ZSTD_compressionParameters *cParams)

{
  uint uVar1;
  U32 local_28;
  U32 local_24;
  U32 local_20;
  uint local_1c;
  U32 minMatch;
  U32 windowLog;
  ZSTD_compressionParameters *cParams_local;
  ldmParams_t *params_local;
  
  uVar1 = cParams->windowLog;
  if (params->bucketSizeLog == 0) {
    params->bucketSizeLog = 3;
  }
  if (params->minMatchLength == 0) {
    params->minMatchLength = 0x40;
  }
  if (ZSTD_btlazy2 < cParams->strategy) {
    if (params->minMatchLength < cParams->targetLength) {
      local_1c = cParams->targetLength;
    }
    else {
      local_1c = params->minMatchLength;
    }
    params->minMatchLength = local_1c;
  }
  if (params->hashLog == 0) {
    if (uVar1 - 7 < 6) {
      local_20 = 6;
    }
    else {
      local_20 = uVar1 - 7;
    }
    params->hashLog = local_20;
  }
  if (params->hashEveryLog == 0) {
    if (uVar1 < params->hashLog) {
      local_24 = 0;
    }
    else {
      local_24 = uVar1 - params->hashLog;
    }
    params->hashEveryLog = local_24;
  }
  if (params->bucketSizeLog < params->hashLog) {
    local_28 = params->bucketSizeLog;
  }
  else {
    local_28 = params->hashLog;
  }
  params->bucketSizeLog = local_28;
  return;
}

Assistant:

void ZSTD_ldm_adjustParameters(ldmParams_t* params,
                               ZSTD_compressionParameters const* cParams)
{
    U32 const windowLog = cParams->windowLog;
    ZSTD_STATIC_ASSERT(LDM_BUCKET_SIZE_LOG <= ZSTD_LDM_BUCKETSIZELOG_MAX);
    DEBUGLOG(4, "ZSTD_ldm_adjustParameters");
    if (!params->bucketSizeLog) params->bucketSizeLog = LDM_BUCKET_SIZE_LOG;
    if (!params->minMatchLength) params->minMatchLength = LDM_MIN_MATCH_LENGTH;
    if (cParams->strategy >= ZSTD_btopt) {
      /* Get out of the way of the optimal parser */
      U32 const minMatch = MAX(cParams->targetLength, params->minMatchLength);
      assert(minMatch >= ZSTD_LDM_MINMATCH_MIN);
      assert(minMatch <= ZSTD_LDM_MINMATCH_MAX);
      params->minMatchLength = minMatch;
    }
    if (params->hashLog == 0) {
        params->hashLog = MAX(ZSTD_HASHLOG_MIN, windowLog - LDM_HASH_RLOG);
        assert(params->hashLog <= ZSTD_HASHLOG_MAX);
    }
    if (params->hashEveryLog == 0) {
        params->hashEveryLog =
                windowLog < params->hashLog ? 0 : windowLog - params->hashLog;
    }
    params->bucketSizeLog = MIN(params->bucketSizeLog, params->hashLog);
}